

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

void random_steal(__cilkrts_worker *w)

{
  __cilkrts_worker *victim_00;
  int iVar1;
  cilk_fiber *pcVar2;
  __cilkrts_worker *in_RDI;
  bool bVar3;
  cilk_fiber *unaff_retaddr;
  int ref_count_1;
  int proceed_with_steal;
  int ref_count;
  int32_t victim_id;
  int success;
  int n;
  cilk_fiber *fiber;
  __cilkrts_worker *victim;
  undefined4 in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffcc;
  int32_t victim_id_00;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint local_20;
  
  local_20 = 0;
  in_RDI->l->work_stolen = 0;
  if (in_RDI->g->stealing_disabled == 0) {
    victim_id_00 = CONCAT13(1,in_stack_ffffffffffffffcc);
    if (in_RDI->l->type != WORKER_SYSTEM) {
      victim_id_00 = CONCAT13(in_RDI->l->team == in_RDI,in_stack_ffffffffffffffcc);
    }
    if ((char)((uint)victim_id_00 >> 0x18) == '\0') {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0x390,"w->l->type == WORKER_SYSTEM || w->l->team == w");
    }
    if (in_RDI->g->total_workers < 2) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0x394,"w->g->total_workers > 1");
    }
    do {
      myrand(in_RDI);
      iVar1 = replay_get_next_recorded_victim
                        ((__cilkrts_worker *)CONCAT44(victim_id_00,in_stack_ffffffffffffffc8),0);
      if (iVar1 == -1) {
        return;
      }
      victim_00 = in_RDI->g->workers[iVar1];
    } while (victim_00 == (__cilkrts_worker *)0x0);
    pcVar2 = cilk_fiber_allocate((cilk_fiber_pool *)0x116d98);
    if (pcVar2 != (cilk_fiber *)0x0) {
      if (victim_00 == in_RDI) {
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                      ,0x3b6,"victim != w");
      }
      iVar1 = can_steal_from(victim_00);
      if (iVar1 == 0) {
        iVar1 = cilk_fiber_remove_reference
                          ((cilk_fiber *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (cilk_fiber_pool *)CONCAT44(victim_id_00,in_stack_ffffffffffffffc8));
        if (iVar1 != 0) {
          __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                        ,0x3c0,"0 == ref_count");
        }
      }
      else {
        iVar1 = worker_trylock_other
                          ((__cilkrts_worker *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (__cilkrts_worker *)CONCAT44(victim_id_00,in_stack_ffffffffffffffc8));
        if (iVar1 != 0) {
          if ((((in_RDI->l->type != WORKER_USER) || (victim_00->l->team == in_RDI)) &&
              (victim_00->l->frame_ff != (full_frame *)0x0)) &&
             (iVar1 = dekker_protocol((__cilkrts_worker *)
                                      CONCAT44(victim_id_00,in_stack_ffffffffffffffc8)), iVar1 != 0)
             ) {
            in_stack_ffffffffffffffd4 = 1;
            iVar1 = replay_match_victim_pedigree
                              ((__cilkrts_worker *)CONCAT44(victim_id_00,in_stack_ffffffffffffffc8),
                               (__cilkrts_worker *)0x116eeb);
            if (iVar1 == 0) {
              decrement_E(victim_00);
              in_stack_ffffffffffffffd4 = 0;
            }
            bVar3 = in_stack_ffffffffffffffd4 != 0;
            if (bVar3) {
              detach_for_steal(_ref_count,_ref_count_1,unaff_retaddr);
            }
            local_20 = (uint)bVar3;
          }
          worker_unlock_other((__cilkrts_worker *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (__cilkrts_worker *)CONCAT44(victim_id_00,in_stack_ffffffffffffffc8));
        }
        in_RDI->l->work_stolen = local_20;
        if (local_20 == 0) {
          iVar1 = cilk_fiber_remove_reference
                            ((cilk_fiber *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             (cilk_fiber_pool *)CONCAT44(victim_id_00,in_stack_ffffffffffffffc8));
          if (iVar1 != 0) {
            __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                          ,0x414,"0 == ref_count");
          }
        }
        else {
          cilk_fiber_reset_state
                    ((cilk_fiber *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (cilk_fiber_proc)CONCAT44(victim_id_00,in_stack_ffffffffffffffc8));
          replay_record_steal((__cilkrts_worker *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              victim_id_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void random_steal(__cilkrts_worker *w)
{
    __cilkrts_worker *victim = NULL;
    cilk_fiber *fiber = NULL;
    int n;
    int success = 0;
    int32_t victim_id;

    // Nothing's been stolen yet. When true, this will flag
    // setup_for_execution_pedigree to increment the pedigree
    w->l->work_stolen = 0;

    /* If the user has disabled stealing (using the debugger) we fail */
    if (__builtin_expect(w->g->stealing_disabled, 0))
        return;

    CILK_ASSERT(w->l->type == WORKER_SYSTEM || w->l->team == w);

    /* If there is only one processor work can still be stolen.
       There must be only one worker to prevent stealing. */
    CILK_ASSERT(w->g->total_workers > 1);

    /* pick random *other* victim */
    do {
        n = myrand(w) % (w->g->total_workers - 1);
        if (n >= w->self)
            ++n;

        // If we're replaying a log, override the victim.  -1 indicates that
        // we've exhausted the list of things this worker stole when we recorded
        // the log so just return.  If we're not replaying a log,
        // replay_get_next_recorded_victim() just returns the victim ID passed in.
        n = replay_get_next_recorded_victim(w, n);
        if (-1 == n)
            return;

        victim = w->g->workers[n];
    } while (victim == NULL); /* when the rts is being initialized, other workers are not yet ready */

    START_INTERVAL(w, INTERVAL_FIBER_ALLOCATE) {
        /* Verify that we can get a stack.  If not, no need to continue. */
        fiber = cilk_fiber_allocate(&w->l->fiber_pool);
    } STOP_INTERVAL(w, INTERVAL_FIBER_ALLOCATE);


    if (NULL == fiber) {
#if FIBER_DEBUG >= 2
        fprintf(stderr, "w=%d: failed steal because we could not get a fiber\n",
                w->self);
#endif        
        return;
    }

    /* do not steal from self */
    CILK_ASSERT (victim != w);

    /* Execute a quick check before engaging in the THE protocol.
       Avoid grabbing locks if there is nothing to steal. */
    if (!can_steal_from(victim)) {
        NOTE_INTERVAL(w, INTERVAL_STEAL_FAIL_EMPTYQ);
        START_INTERVAL(w, INTERVAL_FIBER_DEALLOCATE) {
            int ref_count = cilk_fiber_remove_reference(fiber, &w->l->fiber_pool);
            // Fibers we use when trying to steal should not be active,
            // and thus should not have any other references.
            CILK_ASSERT(0 == ref_count);
        } STOP_INTERVAL(w, INTERVAL_FIBER_DEALLOCATE);
        return;
    }
    
    /* Attempt to steal work from the victim */
    if (worker_trylock_other(w, victim)) {
        if (w->l->type == WORKER_USER && victim->l->team != w) {

            // Fail to steal if this is a user worker and the victim is not
            // on this team.  If a user worker were allowed to steal work
            // descended from another user worker, the former might not be
            // done with its work by the time it was needed to resume and
            // unbind.  Therefore, user workers are not permitted to change
            // teams.

            // There is no race on the victim's team because the victim cannot
            // change its team until it runs out of work to do, at which point
            // it will try to take out its own lock, and this worker already
            // holds it.
            NOTE_INTERVAL(w, INTERVAL_STEAL_FAIL_USER_WORKER);

        } else if (victim->l->frame_ff) {
            // A successful steal will change victim->frame_ff, even
            // though the victim may be executing.  Thus, the lock on
            // the victim's deque is also protecting victim->frame_ff.
            if (dekker_protocol(victim)) {
                int proceed_with_steal = 1; // optimistic

                // If we're replaying a log, verify that this the correct frame
                // to steal from the victim
                if (! replay_match_victim_pedigree(w, victim))
                {
                    // Abort the steal attempt. decrement_E(victim) to
                    // counter the increment_E(victim) done by the
                    // dekker protocol
                    decrement_E(victim);
                    proceed_with_steal = 0;
                }

                if (proceed_with_steal)
                {
                    START_INTERVAL(w, INTERVAL_STEAL_SUCCESS) {
                        success = 1;
                        detach_for_steal(w, victim, fiber);
                        victim_id = victim->self;

                        #if REDPAR_DEBUG >= 1
                        fprintf(stderr, "Wkr %d stole from victim %d, fiber = %p\n",
                                w->self, victim->self, fiber);
                        #endif

                        // The use of victim->self contradicts our
                        // classification of the "self" field as 
                        // local.  But since this code is only for
                        // debugging, it is ok.
                        DBGPRINTF ("%d-%p: Stealing work from worker %d\n"
                            "            sf: %p, call parent: %p\n",
                            w->self, GetCurrentFiber(), victim->self,
                            w->l->next_frame_ff->call_stack,
                            w->l->next_frame_ff->call_stack->call_parent);
                    } STOP_INTERVAL(w, INTERVAL_STEAL_SUCCESS);
                }  // end if(proceed_with_steal)
            } else {
                NOTE_INTERVAL(w, INTERVAL_STEAL_FAIL_DEKKER);
            }
        } else {
            NOTE_INTERVAL(w, INTERVAL_STEAL_FAIL_EMPTYQ);
        }
        worker_unlock_other(w, victim);
    } else {
        NOTE_INTERVAL(w, INTERVAL_STEAL_FAIL_LOCK);
    }

    // Record whether work was stolen.  When true, this will flag
    // setup_for_execution_pedigree to increment the pedigree
    w->l->work_stolen = success;

    if (0 == success) {
        // failed to steal work.  Return the fiber to the pool.
        START_INTERVAL(w, INTERVAL_FIBER_DEALLOCATE) {
            int ref_count = cilk_fiber_remove_reference(fiber, &w->l->fiber_pool);
            // Fibers we use when trying to steal should not be active,
            // and thus should not have any other references.
            CILK_ASSERT(0 == ref_count);
        } STOP_INTERVAL(w, INTERVAL_FIBER_DEALLOCATE);
    }
    else
    {
        // Since our steal was successful, finish initialization of
        // the fiber.
        cilk_fiber_reset_state(fiber,
                               fiber_proc_to_resume_user_code_for_random_steal);
        // Record the pedigree of the frame that w has stolen.
        // record only if CILK_RECORD_LOG is set
        replay_record_steal(w, victim_id);
    }
}